

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall TestMaterial::TestAnimation(TestMaterial *this)

{
  double *pdVar1;
  Vector3T *pVVar2;
  clock_t cVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  Vector3 position;
  double angle;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  oldPos;
  Vector3T<double,_false> vr;
  Vector3T<double,_false> local_f8;
  double local_e0;
  long local_d8;
  double local_d0;
  void *local_c8;
  iterator iStack_c0;
  Vector3T<double,_false> *local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  clock_t local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TestAnimation",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  local_f8.m_x = 3.0;
  local_f8.m_y = 3.0;
  local_f8.m_z = 3.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_98 = 1.0;
  local_d0 = 0.0;
  local_b8 = (Vector3T<double,_false> *)0x0;
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (Vector3T<double,_false> *)0x0;
  if (*(long *)&this->field_0x10 != *(long *)&this->field_0x8) {
    lVar7 = -3;
    lVar5 = -2;
    uVar8 = 0;
    uVar9 = 0;
    uVar6 = 0;
    do {
      local_f8.m_x = (double)(long)(lVar5 + (uVar8 / 5) * -5) * 0.2;
      local_f8.m_y = (double)(long)(lVar7 + (uVar9 / 3 & 0xfffffffffffffffe) * -3) *
                     0.8333333333333334 * 0.2;
      local_f8.m_z = (double)(long)((uVar9 / 7) * -7 + lVar7) * 0.7142857142857143 * 0.2;
      if (iStack_c0._M_current == local_b8) {
        std::
        vector<CD_Matrix::Vector3T<double,false>,std::allocator<CD_Matrix::Vector3T<double,false>>>
        ::_M_realloc_insert<CD_Matrix::Vector3T<double,false>const&>
                  ((vector<CD_Matrix::Vector3T<double,false>,std::allocator<CD_Matrix::Vector3T<double,false>>>
                    *)&local_c8,iStack_c0,&local_f8);
      }
      else {
        (iStack_c0._M_current)->m_z = local_f8.m_z;
        (iStack_c0._M_current)->m_x = local_f8.m_x;
        (iStack_c0._M_current)->m_y = local_f8.m_y;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
      sch::S_Object::setOrientation
                (*(double **)(*(long *)&this->field_0x8 + uVar6 * 8),(Vector3T *)&local_d0);
      sch::S_Object::setPosition(*(Vector3T **)(*(long *)&this->field_0x8 + uVar6 * 8));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 5;
      uVar9 = uVar9 + 5;
      lVar5 = lVar5 + 7;
      uVar8 = uVar8 + 7;
    } while (uVar6 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3));
  }
  sch::CD_Scene::sceneProximityQuery();
  display();
  local_d8 = 0;
  local_88 = clock();
  do {
    if (*(long *)&this->field_0x10 != *(long *)&this->field_0x8) {
      local_80 = (double)local_d8;
      local_e0 = local_80 * 0.0006000000000000001;
      local_70 = local_80 * 0.00030000000000000003;
      local_78 = local_80 * 0.0015;
      local_80 = local_80 * 0.00045;
      uVar6 = 0;
      do {
        pdVar1 = (double *)((long)local_c8 + uVar6 * 0x18);
        local_f8.m_x = *pdVar1;
        local_f8.m_y = pdVar1[1];
        local_f8.m_z = *(double *)((long)local_c8 + uVar6 * 0x18 + 0x10);
        auVar15._8_4_ = (int)(uVar6 >> 0x20);
        auVar15._0_8_ = uVar6;
        auVar15._12_4_ = 0x45300000;
        dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
        dVar10 = sin(local_e0);
        local_a8 = sin(dVar10 * (dVar14 + 42.0));
        dVar10 = sin(local_e0);
        dStack_a0 = sin(dVar10 * (-43.0 - dVar14));
        dVar10 = sin(local_70);
        local_98 = cos(dVar10 * (dVar14 + 83.0));
        dVar10 = sin(local_78);
        dVar10 = sin(dVar10 * 0.2);
        local_d0 = sin(dVar10 * (97.0 - dVar14));
        local_d0 = local_d0 * 4.0;
        sch::S_Object::setOrientation
                  (*(double **)(*(long *)&this->field_0x8 + uVar6 * 8),(Vector3T *)&local_d0);
        pVVar2 = *(Vector3T **)(*(long *)&this->field_0x8 + uVar6 * 8);
        dVar10 = sin(local_e0);
        dVar10 = sin(dVar10 * ((double)((int)uVar6 + (int)(uVar6 / 3) * -3 + 1) * 20.0 +
                              dVar14 + dVar14));
        lVar5 = uVar6 * 2 + 0xd3;
        if ((uVar6 & 1) != 0) {
          lVar5 = uVar6 * 2 + 0x47;
        }
        auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar12._0_8_ = lVar5;
        auVar12._12_4_ = 0x45300000;
        dVar14 = sin(local_80);
        dVar14 = sin(dVar14 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)));
        lVar5 = ((uVar6 * 5) / 7) * -0x23 + uVar6 * 0x1c + 0x14;
        auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar13._0_8_ = lVar5;
        auVar13._12_4_ = 0x45300000;
        dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
        local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
        dVar11 = sin(local_e0);
        dVar11 = sin(dVar11 * local_48);
        local_68 = dVar10 * 0.6 + local_f8.m_x;
        dStack_60 = dVar14 * 0.6 + local_f8.m_y;
        local_58 = dVar11 * 0.6 + local_f8.m_z;
        sch::S_Object::setPosition(pVVar2);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3));
    }
    sch::CD_Scene::sceneProximityQuery();
    display();
    local_d8 = local_d8 + 1;
  } while (local_d8 != 10000);
  cVar3 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  dVar10 = (double)(cVar3 - local_88) / 1000000.0;
  poVar4 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  poVar4 = std::ostream::_M_insert<double>(dVar10 / 10000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return;
}

Assistant:

void TestMaterial::TestAnimation()
{
  std::cout << "TestAnimation" << std::endl;
  Vector3 position(3, 3, 3);
  Vector3 axe(0, 0, 1);
  double angle(0);

  std::vector<Vector3> oldPos;

  for (size_t i=0; i<sObj.size(); i++)
  {
    position[0] =(Scalar(7*i%5)-2.)*DispersionScale;
    position[1] =((Scalar(5*i%6)-3.)*(5.0/6.))*DispersionScale;
    position[2] =((Scalar(5*i%7)-3.)*(5.0/7.))*DispersionScale;

    oldPos.push_back(position);

    sObj[i]->setOrientation(angle,axe);
    sObj[i]->setPosition(position);
  }

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_animationtest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
# endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif

#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif

  begin=clock();

  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
    {
      position=oldPos[j];

      Scalar is= Scalar(i), js = Scalar(j);


      axe[0] =  sin((42+js)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43-js)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83+js)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97-js)*sin(0.2*sin(0.5*AnimationSpeed*is)));


      sObj[j]->setOrientation(angle,axe);

      sObj[j]->setPosition( position + Vector3(sin((20*Scalar(j%3+1)+2*js)*sin(0.2*AnimationSpeed*is)),
                            sin(Scalar(71-140*(j%2-1)+2*j)*sin(0.15*AnimationSpeed*is)),
                            sin(Scalar(20+((j*5)%7)*5+3*j)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }



#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE        
        (void) distance; ///prevent warning about unused variable
# else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

# ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
# endif // IRREGULARITIES_COUNTERS




# ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
# endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif


#ifdef DISPLAY_DISTANCE
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        std::cout<<distance<<std::endl;
      }
    }
#endif

    display();
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) << std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
  outfile  <<"Irregularities : "<<irrCpt<<std::endl;
#endif


#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
  outfile   << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
#endif

#ifdef OUTPUT_FILE
  outfile.close();
#endif

}